

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testExtendByPoint<int>(char *type)

{
  ostream *poVar1;
  int *piVar2;
  char *in_RDI;
  float fVar3;
  int p_1;
  uint j;
  int max;
  int min;
  Interval<int> b_1;
  uint i_1;
  Interval<int> b;
  int p;
  uint i;
  uint iters;
  Rand32 rand;
  float in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar4;
  int local_38;
  int local_34;
  Interval<int> local_30;
  uint local_28;
  Interval<int> local_24;
  int local_1c;
  uint local_18;
  undefined4 local_14;
  char *local_8;
  
  local_8 = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
  poVar1 = std::operator<<(poVar1,local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Rand32::Rand32
            ((Rand32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             CONCAT17(in_stack_ffffffffffffffbf,
                      CONCAT16(in_stack_ffffffffffffffbe,
                               CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))));
  local_14 = 10;
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    fVar3 = Imath_3_2::Rand32::nextf
                      ((Rand32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (float)CONCAT13(in_stack_ffffffffffffffbf,
                                       CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)
                                      ),in_stack_ffffffffffffffb8);
    local_1c = (int)fVar3;
    Imath_3_2::Interval<int>::Interval((Interval<int> *)0x16c24d);
    Imath_3_2::Interval<int>::extendBy(&local_24,&local_1c);
    in_stack_ffffffffffffffbf = local_24.min == local_1c && local_24.max == local_1c;
    if (local_24.min != local_1c || local_24.max != local_1c) {
      __assert_fail("b.min == p && b.max == p",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                    ,0xae,"void (anonymous namespace)::testExtendByPoint(const char *) [T = int]");
    }
  }
  local_28 = 0;
  do {
    if (9 < local_28) {
      return;
    }
    Imath_3_2::Interval<int>::Interval((Interval<int> *)0x16c2d5);
    for (uVar4 = 0; uVar4 < local_28; uVar4 = uVar4 + 1) {
      fVar3 = Imath_3_2::Rand32::nextf
                        ((Rand32 *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
                         (float)CONCAT13(in_stack_ffffffffffffffbf,
                                         CONCAT12(in_stack_ffffffffffffffbe,
                                                  in_stack_ffffffffffffffbc)),
                         in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc0 = (int)fVar3;
      if (uVar4 == 0) {
        local_38 = in_stack_ffffffffffffffc0;
        local_34 = in_stack_ffffffffffffffc0;
      }
      piVar2 = std::min<int>(&local_34,(int *)&stack0xffffffffffffffc0);
      local_34 = *piVar2;
      piVar2 = std::max<int>(&local_38,(int *)&stack0xffffffffffffffc0);
      local_38 = *piVar2;
      Imath_3_2::Interval<int>::extendBy(&local_30,(int *)&stack0xffffffffffffffc0);
      in_stack_ffffffffffffffbe = local_30.min == local_34 && local_30.max == local_38;
      if (local_30.min != local_34 || local_30.max != local_38) {
        __assert_fail("b.min == min && b.max == max",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                      ,0xcb,"void (anonymous namespace)::testExtendByPoint(const char *) [T = int]")
        ;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void
testExtendByPoint (const char* type)
{
    cout << "    extendBy() point for type " << type << endl;

    IMATH_INTERNAL_NAMESPACE::Rand32 rand (0);

    const unsigned int iters = 10;

    //
    // Extend empty interval with a single point.
    //
    for (unsigned int i = 0; i < iters; i++)
    {
        T p (static_cast<T>(rand.nextf (-12345, 12345)));
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        b.extendBy (p);
        assert (b.min == p && b.max == p);
    }

    //
    // Extend empty interval with a number of random points. Note that
    // this also covers extending a non-empty interval.
    //
    for (unsigned int i = 0; i < iters; i++)
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;

        T min;
        T max;

        for (unsigned int j = 0; j < i; j++)
        {
            T p (static_cast<T>(rand.nextf (-12345, 12345)));

            if (j == 0)
            {
                min = p;
                max = p;
            }

            min = std::min (min, p);
            max = std::max (max, p);

            b.extendBy (p);

            assert (b.min == min && b.max == max);
        }
    }
}